

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSpvAsmInstructionTests.cpp
# Opt level: O1

TestCaseGroup * vkt::SpirVAssembly::createSpecConstantTests(TestContext *testCtx)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _Base_ptr *pp_Var2;
  mapped_type *pmVar3;
  size_t sVar4;
  long lVar5;
  int *piVar6;
  char *pcVar7;
  pointer pSVar8;
  char *pcVar9;
  ulong uVar10;
  byte bVar11;
  vector<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
  cases;
  RGBA outputColors2 [4];
  string local_bd8;
  vector<int,_std::allocator<int>_> specConstants;
  char decorations2 [82];
  key_type local_b40;
  TestCaseGroup *local_b20;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  fragments;
  RGBA inputColors [4];
  char typesAndConstants2 [1402];
  char selectFalseUsingSc [39];
  char decorations1 [55];
  char selectTrueUsingSc [39];
  char addZeroToSc [28];
  char function2 [442];
  char typesAndConstants1 [134];
  char function1 [505];
  
  bVar11 = 0;
  local_b20 = (TestCaseGroup *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            (local_b20,testCtx,"opspecconstantop","Test the OpSpecConstantOp instruction");
  cases.
  super__Vector_base<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  cases.
  super__Vector_base<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  cases.
  super__Vector_base<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  inputColors[0].m_value = 0;
  inputColors[1].m_value = 0;
  inputColors[2].m_value = 0;
  inputColors[3].m_value = 0;
  outputColors2[0].m_value = 0;
  outputColors2[1].m_value = 0;
  outputColors2[2].m_value = 0;
  outputColors2[3].m_value = 0;
  builtin_strncpy(decorations1,"OpDecorate %sc_0  SpecId 0\nOpDecorate %sc_1  SpecId 1\n",0x37);
  memcpy(typesAndConstants1,
         "%sc_0      = OpSpecConstant${SC_DEF0}\n%sc_1      = OpSpecConstant${SC_DEF1}\n%sc_op     = OpSpecConstantOp ${SC_RESULT_TYPE} ${SC_OP}\n"
         ,0x86);
  memcpy(function1,
         "%test_code = OpFunction %v4f32 None %v4f32_function\n%param     = OpFunctionParameter %v4f32\n%label     = OpLabel\n%result    = OpVariable %fp_v4f32 Function\n             OpStore %result %param\n%gen       = ${GEN_RESULT}\n%index     = OpIAdd %i32 %gen %c_i32_1\n%loc       = OpAccessChain %fp_f32 %result %index\n%val       = OpLoad %f32 %loc\n%add       = OpFAdd %f32 %val %c_f32_0_5\n             OpStore %loc %add\n%ret       = OpLoad %v4f32 %result\n             OpReturnValue %ret\n             OpFunctionEnd\n"
         ,0x1f9);
  inputColors[0].m_value = 0xff7f7f7f;
  inputColors[1].m_value = 0xff00007f;
  inputColors[2].m_value = 0xff007f00;
  inputColors[3].m_value = 0xff7f0000;
  outputColors2[0].m_value = 0xffff7f7f;
  outputColors2[1].m_value = 0xff80007f;
  outputColors2[2].m_value = 0xff807f00;
  outputColors2[3].m_value = 0xffff0000;
  builtin_strncpy(addZeroToSc + 0x10,"32_0 %sc_op",0xc);
  builtin_strncpy(addZeroToSc,"OpIAdd %i32 %c_i",0x10);
  builtin_strncpy(selectTrueUsingSc,"OpSelect %i32 %sc_op %c_i32_1 %c_i32_0",0x27);
  builtin_strncpy(selectFalseUsingSc,"OpSelect %i32 %sc_op %c_i32_0 %c_i32_1",0x27);
  typesAndConstants2._0_8_ = anon_var_dwarf_96951d;
  typesAndConstants2._8_8_ = anon_var_dwarf_969528;
  typesAndConstants2._16_8_ = anon_var_dwarf_969528;
  typesAndConstants2._24_8_ = (long)"%type = OpTypePointer Function %i32" + 0x1f;
  typesAndConstants2._32_8_ = anon_var_dwarf_96953e;
  typesAndConstants2[0x28] = '\x13';
  typesAndConstants2[0x29] = '\0';
  typesAndConstants2[0x2a] = '\0';
  typesAndConstants2[0x2b] = '\0';
  typesAndConstants2[0x2c] = -0x14;
  typesAndConstants2[0x2d] = -1;
  typesAndConstants2[0x2e] = -1;
  typesAndConstants2[0x2f] = -1;
  typesAndConstants2._48_8_ = addZeroToSc;
  typesAndConstants2[0x38] = -1;
  typesAndConstants2[0x39] = '\x7f';
  typesAndConstants2[0x3a] = '\x7f';
  typesAndConstants2[0x3b] = -1;
  typesAndConstants2[0x3c] = -1;
  typesAndConstants2[0x3d] = '\0';
  typesAndConstants2[0x3e] = '\0';
  typesAndConstants2[0x3f] = -1;
  typesAndConstants2[0x40] = -0x80;
  typesAndConstants2[0x41] = '\x7f';
  typesAndConstants2[0x42] = '\0';
  typesAndConstants2[0x43] = -1;
  typesAndConstants2[0x44] = -0x80;
  typesAndConstants2[0x45] = '\0';
  typesAndConstants2[0x46] = '\x7f';
  typesAndConstants2[0x47] = -1;
  if (cases.
      super__Vector_base<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      cases.
      super__Vector_base<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
    ::_M_realloc_insert<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>
              (&cases,(iterator)
                      cases.
                      super__Vector_base<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
                      ._M_impl.super__Vector_impl_data._M_finish,
               (SpecConstantTwoIntGraphicsCase *)typesAndConstants2);
  }
  else {
    pcVar7 = typesAndConstants2;
    pSVar8 = cases.
             super__Vector_base<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (lVar5 = 9; lVar5 != 0; lVar5 = lVar5 + -1) {
      pSVar8->caseName = *(char **)pcVar7;
      pcVar7 = pcVar7 + (ulong)bVar11 * -0x10 + 8;
      pSVar8 = (pointer)((long)pSVar8 + (ulong)bVar11 * -0x10 + 8);
    }
    cases.
    super__Vector_base<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         cases.
         super__Vector_base<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
         ._M_impl.super__Vector_impl_data._M_finish + 1;
  }
  typesAndConstants2._0_8_ = anon_var_dwarf_969555;
  typesAndConstants2._8_8_ = anon_var_dwarf_969528;
  typesAndConstants2._16_8_ = anon_var_dwarf_969528;
  typesAndConstants2._24_8_ = (long)"%type = OpTypePointer Function %i32" + 0x1f;
  typesAndConstants2._32_8_ = anon_var_dwarf_969560;
  typesAndConstants2[0x28] = '\x13';
  typesAndConstants2[0x29] = '\0';
  typesAndConstants2[0x2a] = '\0';
  typesAndConstants2[0x2b] = '\0';
  typesAndConstants2[0x2c] = '\x14';
  typesAndConstants2[0x2d] = '\0';
  typesAndConstants2[0x2e] = '\0';
  typesAndConstants2[0x2f] = '\0';
  typesAndConstants2._48_8_ = addZeroToSc;
  typesAndConstants2[0x38] = -1;
  typesAndConstants2[0x39] = '\x7f';
  typesAndConstants2[0x3a] = '\x7f';
  typesAndConstants2[0x3b] = -1;
  typesAndConstants2[0x3c] = -1;
  typesAndConstants2[0x3d] = '\0';
  typesAndConstants2[0x3e] = '\0';
  typesAndConstants2[0x3f] = -1;
  typesAndConstants2[0x40] = -0x80;
  typesAndConstants2[0x41] = '\x7f';
  typesAndConstants2[0x42] = '\0';
  typesAndConstants2[0x43] = -1;
  typesAndConstants2[0x44] = -0x80;
  typesAndConstants2[0x45] = '\0';
  typesAndConstants2[0x46] = '\x7f';
  typesAndConstants2[0x47] = -1;
  if (cases.
      super__Vector_base<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      cases.
      super__Vector_base<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
    ::_M_realloc_insert<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>
              (&cases,(iterator)
                      cases.
                      super__Vector_base<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
                      ._M_impl.super__Vector_impl_data._M_finish,
               (SpecConstantTwoIntGraphicsCase *)typesAndConstants2);
  }
  else {
    pcVar7 = typesAndConstants2;
    pSVar8 = cases.
             super__Vector_base<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (lVar5 = 9; lVar5 != 0; lVar5 = lVar5 + -1) {
      pSVar8->caseName = *(char **)pcVar7;
      pcVar7 = pcVar7 + (ulong)bVar11 * -0x10 + 8;
      pSVar8 = (pointer)((long)pSVar8 + (ulong)bVar11 * -0x10 + 8);
    }
    cases.
    super__Vector_base<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         cases.
         super__Vector_base<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
         ._M_impl.super__Vector_impl_data._M_finish + 1;
  }
  typesAndConstants2._0_8_ = anon_var_dwarf_96956b;
  typesAndConstants2._8_8_ = anon_var_dwarf_969528;
  typesAndConstants2._16_8_ = anon_var_dwarf_969528;
  typesAndConstants2._24_8_ = (long)"%type = OpTypePointer Function %i32" + 0x1f;
  typesAndConstants2._32_8_ = anon_var_dwarf_969576;
  typesAndConstants2[0x28] = -1;
  typesAndConstants2[0x29] = -1;
  typesAndConstants2[0x2a] = -1;
  typesAndConstants2[0x2b] = -1;
  typesAndConstants2[0x2c] = -1;
  typesAndConstants2[0x2d] = -1;
  typesAndConstants2[0x2e] = -1;
  typesAndConstants2[0x2f] = -1;
  typesAndConstants2._48_8_ = addZeroToSc;
  typesAndConstants2._56_8_ = outputColors2._0_8_;
  typesAndConstants2._64_8_ = outputColors2._8_8_;
  if (cases.
      super__Vector_base<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      cases.
      super__Vector_base<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
    ::_M_realloc_insert<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>
              (&cases,(iterator)
                      cases.
                      super__Vector_base<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
                      ._M_impl.super__Vector_impl_data._M_finish,
               (SpecConstantTwoIntGraphicsCase *)typesAndConstants2);
  }
  else {
    pcVar7 = typesAndConstants2;
    pSVar8 = cases.
             super__Vector_base<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (lVar5 = 9; lVar5 != 0; lVar5 = lVar5 + -1) {
      pSVar8->caseName = *(char **)pcVar7;
      pcVar7 = pcVar7 + (ulong)bVar11 * -0x10 + 8;
      pSVar8 = (pointer)((long)pSVar8 + (ulong)bVar11 * -0x10 + 8);
    }
    cases.
    super__Vector_base<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         cases.
         super__Vector_base<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
         ._M_impl.super__Vector_impl_data._M_finish + 1;
  }
  typesAndConstants2._0_8_ = anon_var_dwarf_969581;
  typesAndConstants2._8_8_ = anon_var_dwarf_969528;
  typesAndConstants2._16_8_ = anon_var_dwarf_969528;
  typesAndConstants2._24_8_ = (long)"%type = OpTypePointer Function %i32" + 0x1f;
  typesAndConstants2._32_8_ = anon_var_dwarf_96958c;
  typesAndConstants2[0x28] = -0x7e;
  typesAndConstants2[0x29] = -1;
  typesAndConstants2[0x2a] = -1;
  typesAndConstants2[0x2b] = -1;
  typesAndConstants2[0x2c] = '~';
  typesAndConstants2[0x2d] = '\0';
  typesAndConstants2[0x2e] = '\0';
  typesAndConstants2[0x2f] = '\0';
  typesAndConstants2._48_8_ = addZeroToSc;
  typesAndConstants2[0x38] = -1;
  typesAndConstants2[0x39] = '\x7f';
  typesAndConstants2[0x3a] = '\x7f';
  typesAndConstants2[0x3b] = -1;
  typesAndConstants2[0x3c] = -1;
  typesAndConstants2[0x3d] = '\0';
  typesAndConstants2[0x3e] = '\0';
  typesAndConstants2[0x3f] = -1;
  typesAndConstants2[0x40] = -0x80;
  typesAndConstants2[0x41] = '\x7f';
  typesAndConstants2[0x42] = '\0';
  typesAndConstants2[0x43] = -1;
  typesAndConstants2[0x44] = -0x80;
  typesAndConstants2[0x45] = '\0';
  typesAndConstants2[0x46] = '\x7f';
  typesAndConstants2[0x47] = -1;
  if (cases.
      super__Vector_base<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      cases.
      super__Vector_base<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
    ::_M_realloc_insert<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>
              (&cases,(iterator)
                      cases.
                      super__Vector_base<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
                      ._M_impl.super__Vector_impl_data._M_finish,
               (SpecConstantTwoIntGraphicsCase *)typesAndConstants2);
  }
  else {
    pcVar7 = typesAndConstants2;
    pSVar8 = cases.
             super__Vector_base<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (lVar5 = 9; lVar5 != 0; lVar5 = lVar5 + -1) {
      pSVar8->caseName = *(char **)pcVar7;
      pcVar7 = pcVar7 + (ulong)bVar11 * -0x10 + 8;
      pSVar8 = (pointer)((long)pSVar8 + (ulong)bVar11 * -0x10 + 8);
    }
    cases.
    super__Vector_base<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         cases.
         super__Vector_base<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
         ._M_impl.super__Vector_impl_data._M_finish + 1;
  }
  typesAndConstants2._0_8_ = anon_var_dwarf_969597;
  typesAndConstants2._8_8_ = anon_var_dwarf_969528;
  typesAndConstants2._16_8_ = anon_var_dwarf_969528;
  typesAndConstants2._24_8_ = (long)"%type = OpTypePointer Function %i32" + 0x1f;
  typesAndConstants2._32_8_ = anon_var_dwarf_9695a2;
  typesAndConstants2[0x28] = '~';
  typesAndConstants2[0x29] = '\0';
  typesAndConstants2[0x2a] = '\0';
  typesAndConstants2[0x2b] = '\0';
  typesAndConstants2[0x2c] = '~';
  typesAndConstants2[0x2d] = '\0';
  typesAndConstants2[0x2e] = '\0';
  typesAndConstants2[0x2f] = '\0';
  typesAndConstants2._48_8_ = addZeroToSc;
  typesAndConstants2._56_8_ = outputColors2._0_8_;
  typesAndConstants2._64_8_ = outputColors2._8_8_;
  if (cases.
      super__Vector_base<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      cases.
      super__Vector_base<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
    ::_M_realloc_insert<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>
              (&cases,(iterator)
                      cases.
                      super__Vector_base<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
                      ._M_impl.super__Vector_impl_data._M_finish,
               (SpecConstantTwoIntGraphicsCase *)typesAndConstants2);
  }
  else {
    pcVar7 = typesAndConstants2;
    pSVar8 = cases.
             super__Vector_base<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (lVar5 = 9; lVar5 != 0; lVar5 = lVar5 + -1) {
      pSVar8->caseName = *(char **)pcVar7;
      pcVar7 = pcVar7 + (ulong)bVar11 * -0x10 + 8;
      pSVar8 = (pointer)((long)pSVar8 + (ulong)bVar11 * -0x10 + 8);
    }
    cases.
    super__Vector_base<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         cases.
         super__Vector_base<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
         ._M_impl.super__Vector_impl_data._M_finish + 1;
  }
  typesAndConstants2._0_8_ = (long)"opsrem" + 2;
  typesAndConstants2._8_8_ = anon_var_dwarf_969528;
  typesAndConstants2._16_8_ = anon_var_dwarf_969528;
  typesAndConstants2._24_8_ = (long)"%type = OpTypePointer Function %i32" + 0x1f;
  typesAndConstants2._32_8_ = anon_var_dwarf_9695b8;
  typesAndConstants2[0x28] = '\x03';
  typesAndConstants2[0x29] = '\0';
  typesAndConstants2[0x2a] = '\0';
  typesAndConstants2[0x2b] = '\0';
  typesAndConstants2[0x2c] = '\x02';
  typesAndConstants2[0x2d] = '\0';
  typesAndConstants2[0x2e] = '\0';
  typesAndConstants2[0x2f] = '\0';
  typesAndConstants2._48_8_ = addZeroToSc;
  typesAndConstants2._56_8_ = outputColors2._0_8_;
  typesAndConstants2._64_8_ = outputColors2._8_8_;
  if (cases.
      super__Vector_base<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      cases.
      super__Vector_base<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
    ::_M_realloc_insert<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>
              (&cases,(iterator)
                      cases.
                      super__Vector_base<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
                      ._M_impl.super__Vector_impl_data._M_finish,
               (SpecConstantTwoIntGraphicsCase *)typesAndConstants2);
  }
  else {
    pcVar7 = typesAndConstants2;
    pSVar8 = cases.
             super__Vector_base<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (lVar5 = 9; lVar5 != 0; lVar5 = lVar5 + -1) {
      pSVar8->caseName = *(char **)pcVar7;
      pcVar7 = pcVar7 + (ulong)bVar11 * -0x10 + 8;
      pSVar8 = (pointer)((long)pSVar8 + (ulong)bVar11 * -0x10 + 8);
    }
    cases.
    super__Vector_base<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         cases.
         super__Vector_base<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
         ._M_impl.super__Vector_impl_data._M_finish + 1;
  }
  typesAndConstants2._0_8_ = (long)"opsmod" + 2;
  typesAndConstants2._8_8_ = anon_var_dwarf_969528;
  typesAndConstants2._16_8_ = anon_var_dwarf_969528;
  typesAndConstants2._24_8_ = (long)"%type = OpTypePointer Function %i32" + 0x1f;
  typesAndConstants2._32_8_ = anon_var_dwarf_9695ce;
  typesAndConstants2[0x28] = '\x03';
  typesAndConstants2[0x29] = '\0';
  typesAndConstants2[0x2a] = '\0';
  typesAndConstants2[0x2b] = '\0';
  typesAndConstants2[0x2c] = '\x02';
  typesAndConstants2[0x2d] = '\0';
  typesAndConstants2[0x2e] = '\0';
  typesAndConstants2[0x2f] = '\0';
  typesAndConstants2._48_8_ = addZeroToSc;
  typesAndConstants2._56_8_ = outputColors2._0_8_;
  typesAndConstants2._64_8_ = outputColors2._8_8_;
  if (cases.
      super__Vector_base<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      cases.
      super__Vector_base<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
    ::_M_realloc_insert<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>
              (&cases,(iterator)
                      cases.
                      super__Vector_base<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
                      ._M_impl.super__Vector_impl_data._M_finish,
               (SpecConstantTwoIntGraphicsCase *)typesAndConstants2);
  }
  else {
    pcVar7 = typesAndConstants2;
    pSVar8 = cases.
             super__Vector_base<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (lVar5 = 9; lVar5 != 0; lVar5 = lVar5 + -1) {
      pSVar8->caseName = *(char **)pcVar7;
      pcVar7 = pcVar7 + (ulong)bVar11 * -0x10 + 8;
      pSVar8 = (pointer)((long)pSVar8 + (ulong)bVar11 * -0x10 + 8);
    }
    cases.
    super__Vector_base<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         cases.
         super__Vector_base<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
         ._M_impl.super__Vector_impl_data._M_finish + 1;
  }
  typesAndConstants2._0_8_ = anon_var_dwarf_9695d9;
  typesAndConstants2._8_8_ = anon_var_dwarf_969528;
  typesAndConstants2._16_8_ = anon_var_dwarf_969528;
  typesAndConstants2._24_8_ = (long)"%type = OpTypePointer Function %i32" + 0x1f;
  typesAndConstants2._32_8_ = anon_var_dwarf_9695e4;
  typesAndConstants2[0x28] = -0x17;
  typesAndConstants2[0x29] = '\x03';
  typesAndConstants2[0x2a] = '\0';
  typesAndConstants2[0x2b] = '\0';
  typesAndConstants2[0x2c] = -0xc;
  typesAndConstants2[0x2d] = '\x01';
  typesAndConstants2[0x2e] = '\0';
  typesAndConstants2[0x2f] = '\0';
  typesAndConstants2._48_8_ = addZeroToSc;
  typesAndConstants2._56_8_ = outputColors2._0_8_;
  typesAndConstants2._64_8_ = outputColors2._8_8_;
  if (cases.
      super__Vector_base<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      cases.
      super__Vector_base<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
    ::_M_realloc_insert<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>
              (&cases,(iterator)
                      cases.
                      super__Vector_base<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
                      ._M_impl.super__Vector_impl_data._M_finish,
               (SpecConstantTwoIntGraphicsCase *)typesAndConstants2);
  }
  else {
    pcVar7 = typesAndConstants2;
    pSVar8 = cases.
             super__Vector_base<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (lVar5 = 9; lVar5 != 0; lVar5 = lVar5 + -1) {
      pSVar8->caseName = *(char **)pcVar7;
      pcVar7 = pcVar7 + (ulong)bVar11 * -0x10 + 8;
      pSVar8 = (pointer)((long)pSVar8 + (ulong)bVar11 * -0x10 + 8);
    }
    cases.
    super__Vector_base<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         cases.
         super__Vector_base<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
         ._M_impl.super__Vector_impl_data._M_finish + 1;
  }
  typesAndConstants2._0_8_ = anon_var_dwarf_9695ef;
  typesAndConstants2._8_8_ = anon_var_dwarf_969528;
  typesAndConstants2._16_8_ = anon_var_dwarf_969528;
  typesAndConstants2._24_8_ = (long)"%type = OpTypePointer Function %i32" + 0x1f;
  typesAndConstants2._32_8_ = anon_var_dwarf_9695fa;
  typesAndConstants2[0x28] = '3';
  typesAndConstants2[0x29] = '\0';
  typesAndConstants2[0x2a] = '\0';
  typesAndConstants2[0x2b] = '\0';
  typesAndConstants2[0x2c] = '\r';
  typesAndConstants2[0x2d] = '\0';
  typesAndConstants2[0x2e] = '\0';
  typesAndConstants2[0x2f] = '\0';
  typesAndConstants2._48_8_ = addZeroToSc;
  typesAndConstants2._56_8_ = outputColors2._0_8_;
  typesAndConstants2._64_8_ = outputColors2._8_8_;
  if (cases.
      super__Vector_base<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      cases.
      super__Vector_base<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
    ::_M_realloc_insert<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>
              (&cases,(iterator)
                      cases.
                      super__Vector_base<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
                      ._M_impl.super__Vector_impl_data._M_finish,
               (SpecConstantTwoIntGraphicsCase *)typesAndConstants2);
  }
  else {
    pcVar7 = typesAndConstants2;
    pSVar8 = cases.
             super__Vector_base<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (lVar5 = 9; lVar5 != 0; lVar5 = lVar5 + -1) {
      pSVar8->caseName = *(char **)pcVar7;
      pcVar7 = pcVar7 + (ulong)bVar11 * -0x10 + 8;
      pSVar8 = (pointer)((long)pSVar8 + (ulong)bVar11 * -0x10 + 8);
    }
    cases.
    super__Vector_base<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         cases.
         super__Vector_base<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
         ._M_impl.super__Vector_impl_data._M_finish + 1;
  }
  typesAndConstants2._0_8_ = anon_var_dwarf_969606;
  typesAndConstants2._8_8_ = anon_var_dwarf_969528;
  typesAndConstants2._16_8_ = anon_var_dwarf_969528;
  typesAndConstants2._24_8_ = (long)"%type = OpTypePointer Function %i32" + 0x1f;
  typesAndConstants2._32_8_ = anon_var_dwarf_969612;
  typesAndConstants2[0x28] = '\0';
  typesAndConstants2[0x29] = '\0';
  typesAndConstants2[0x2a] = '\0';
  typesAndConstants2[0x2b] = '\0';
  typesAndConstants2[0x2c] = '\x01';
  typesAndConstants2[0x2d] = '\0';
  typesAndConstants2[0x2e] = '\0';
  typesAndConstants2[0x2f] = '\0';
  typesAndConstants2._48_8_ = addZeroToSc;
  typesAndConstants2._56_8_ = outputColors2._0_8_;
  typesAndConstants2._64_8_ = outputColors2._8_8_;
  if (cases.
      super__Vector_base<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      cases.
      super__Vector_base<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
    ::_M_realloc_insert<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>
              (&cases,(iterator)
                      cases.
                      super__Vector_base<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
                      ._M_impl.super__Vector_impl_data._M_finish,
               (SpecConstantTwoIntGraphicsCase *)typesAndConstants2);
  }
  else {
    pcVar7 = typesAndConstants2;
    pSVar8 = cases.
             super__Vector_base<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (lVar5 = 9; lVar5 != 0; lVar5 = lVar5 + -1) {
      pSVar8->caseName = *(char **)pcVar7;
      pcVar7 = pcVar7 + (ulong)bVar11 * -0x10 + 8;
      pSVar8 = (pointer)((long)pSVar8 + (ulong)bVar11 * -0x10 + 8);
    }
    cases.
    super__Vector_base<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         cases.
         super__Vector_base<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
         ._M_impl.super__Vector_impl_data._M_finish + 1;
  }
  typesAndConstants2._0_8_ = anon_var_dwarf_96961e;
  typesAndConstants2._8_8_ = anon_var_dwarf_969528;
  typesAndConstants2._16_8_ = anon_var_dwarf_969528;
  typesAndConstants2._24_8_ = (long)"%type = OpTypePointer Function %i32" + 0x1f;
  typesAndConstants2._32_8_ = anon_var_dwarf_96962a;
  typesAndConstants2[0x28] = '.';
  typesAndConstants2[0x29] = '\0';
  typesAndConstants2[0x2a] = '\0';
  typesAndConstants2[0x2b] = '\0';
  typesAndConstants2[0x2c] = '/';
  typesAndConstants2[0x2d] = '\0';
  typesAndConstants2[0x2e] = '\0';
  typesAndConstants2[0x2f] = '\0';
  typesAndConstants2._48_8_ = addZeroToSc;
  typesAndConstants2._56_8_ = outputColors2._0_8_;
  typesAndConstants2._64_8_ = outputColors2._8_8_;
  if (cases.
      super__Vector_base<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      cases.
      super__Vector_base<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
    ::_M_realloc_insert<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>
              (&cases,(iterator)
                      cases.
                      super__Vector_base<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
                      ._M_impl.super__Vector_impl_data._M_finish,
               (SpecConstantTwoIntGraphicsCase *)typesAndConstants2);
  }
  else {
    pcVar7 = typesAndConstants2;
    pSVar8 = cases.
             super__Vector_base<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (lVar5 = 9; lVar5 != 0; lVar5 = lVar5 + -1) {
      pSVar8->caseName = *(char **)pcVar7;
      pcVar7 = pcVar7 + (ulong)bVar11 * -0x10 + 8;
      pSVar8 = (pointer)((long)pSVar8 + (ulong)bVar11 * -0x10 + 8);
    }
    cases.
    super__Vector_base<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         cases.
         super__Vector_base<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
         ._M_impl.super__Vector_impl_data._M_finish + 1;
  }
  typesAndConstants2._0_8_ = anon_var_dwarf_969636;
  typesAndConstants2._8_8_ = anon_var_dwarf_969528;
  typesAndConstants2._16_8_ = anon_var_dwarf_969528;
  typesAndConstants2._24_8_ = (long)"%type = OpTypePointer Function %i32" + 0x1f;
  typesAndConstants2._32_8_ = anon_var_dwarf_969642;
  typesAndConstants2[0x28] = '\x02';
  typesAndConstants2[0x29] = '\0';
  typesAndConstants2[0x2a] = '\0';
  typesAndConstants2[0x2b] = '\0';
  typesAndConstants2[0x2c] = '\x01';
  typesAndConstants2[0x2d] = '\0';
  typesAndConstants2[0x2e] = '\0';
  typesAndConstants2[0x2f] = '\0';
  typesAndConstants2._48_8_ = addZeroToSc;
  typesAndConstants2._56_8_ = outputColors2._0_8_;
  typesAndConstants2._64_8_ = outputColors2._8_8_;
  if (cases.
      super__Vector_base<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      cases.
      super__Vector_base<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
    ::_M_realloc_insert<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>
              (&cases,(iterator)
                      cases.
                      super__Vector_base<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
                      ._M_impl.super__Vector_impl_data._M_finish,
               (SpecConstantTwoIntGraphicsCase *)typesAndConstants2);
  }
  else {
    pcVar7 = typesAndConstants2;
    pSVar8 = cases.
             super__Vector_base<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (lVar5 = 9; lVar5 != 0; lVar5 = lVar5 + -1) {
      pSVar8->caseName = *(char **)pcVar7;
      pcVar7 = pcVar7 + (ulong)bVar11 * -0x10 + 8;
      pSVar8 = (pointer)((long)pSVar8 + (ulong)bVar11 * -0x10 + 8);
    }
    cases.
    super__Vector_base<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         cases.
         super__Vector_base<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
         ._M_impl.super__Vector_impl_data._M_finish + 1;
  }
  typesAndConstants2._0_8_ = anon_var_dwarf_96964e;
  typesAndConstants2._8_8_ = anon_var_dwarf_969528;
  typesAndConstants2._16_8_ = anon_var_dwarf_969528;
  typesAndConstants2._24_8_ = (long)"%type = OpTypePointer Function %i32" + 0x1f;
  typesAndConstants2._32_8_ = anon_var_dwarf_96965a;
  typesAndConstants2[0x28] = -4;
  typesAndConstants2[0x29] = -1;
  typesAndConstants2[0x2a] = -1;
  typesAndConstants2[0x2b] = -1;
  typesAndConstants2[0x2c] = '\x02';
  typesAndConstants2[0x2d] = '\0';
  typesAndConstants2[0x2e] = '\0';
  typesAndConstants2[0x2f] = '\0';
  typesAndConstants2._48_8_ = addZeroToSc;
  typesAndConstants2[0x38] = -1;
  typesAndConstants2[0x39] = '\x7f';
  typesAndConstants2[0x3a] = '\x7f';
  typesAndConstants2[0x3b] = -1;
  typesAndConstants2[0x3c] = -1;
  typesAndConstants2[0x3d] = '\0';
  typesAndConstants2[0x3e] = '\0';
  typesAndConstants2[0x3f] = -1;
  typesAndConstants2[0x40] = -0x80;
  typesAndConstants2[0x41] = '\x7f';
  typesAndConstants2[0x42] = '\0';
  typesAndConstants2[0x43] = -1;
  typesAndConstants2[0x44] = -0x80;
  typesAndConstants2[0x45] = '\0';
  typesAndConstants2[0x46] = '\x7f';
  typesAndConstants2[0x47] = -1;
  if (cases.
      super__Vector_base<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      cases.
      super__Vector_base<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
    ::_M_realloc_insert<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>
              (&cases,(iterator)
                      cases.
                      super__Vector_base<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
                      ._M_impl.super__Vector_impl_data._M_finish,
               (SpecConstantTwoIntGraphicsCase *)typesAndConstants2);
  }
  else {
    pcVar7 = typesAndConstants2;
    pSVar8 = cases.
             super__Vector_base<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (lVar5 = 9; lVar5 != 0; lVar5 = lVar5 + -1) {
      pSVar8->caseName = *(char **)pcVar7;
      pcVar7 = pcVar7 + (ulong)bVar11 * -0x10 + 8;
      pSVar8 = (pointer)((long)pSVar8 + (ulong)bVar11 * -0x10 + 8);
    }
    cases.
    super__Vector_base<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         cases.
         super__Vector_base<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
         ._M_impl.super__Vector_impl_data._M_finish + 1;
  }
  typesAndConstants2._0_8_ = anon_var_dwarf_969666;
  typesAndConstants2._8_8_ = anon_var_dwarf_969528;
  typesAndConstants2._16_8_ = anon_var_dwarf_969528;
  typesAndConstants2._24_8_ = (long)"%type = OpTypePointer Function %i32" + 0x1f;
  typesAndConstants2._32_8_ = anon_var_dwarf_969672;
  typesAndConstants2[0x28] = '\x01';
  typesAndConstants2[0x29] = '\0';
  typesAndConstants2[0x2a] = '\0';
  typesAndConstants2[0x2b] = '\0';
  typesAndConstants2[0x2c] = '\0';
  typesAndConstants2[0x2d] = '\0';
  typesAndConstants2[0x2e] = '\0';
  typesAndConstants2[0x2f] = '\0';
  typesAndConstants2._48_8_ = addZeroToSc;
  typesAndConstants2._56_8_ = outputColors2._0_8_;
  typesAndConstants2._64_8_ = outputColors2._8_8_;
  if (cases.
      super__Vector_base<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      cases.
      super__Vector_base<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
    ::_M_realloc_insert<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>
              (&cases,(iterator)
                      cases.
                      super__Vector_base<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
                      ._M_impl.super__Vector_impl_data._M_finish,
               (SpecConstantTwoIntGraphicsCase *)typesAndConstants2);
  }
  else {
    pcVar7 = typesAndConstants2;
    pSVar8 = cases.
             super__Vector_base<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (lVar5 = 9; lVar5 != 0; lVar5 = lVar5 + -1) {
      pSVar8->caseName = *(char **)pcVar7;
      pcVar7 = pcVar7 + (ulong)bVar11 * -0x10 + 8;
      pSVar8 = (pointer)((long)pSVar8 + (ulong)bVar11 * -0x10 + 8);
    }
    cases.
    super__Vector_base<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         cases.
         super__Vector_base<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
         ._M_impl.super__Vector_impl_data._M_finish + 1;
  }
  typesAndConstants2._0_8_ = anon_var_dwarf_96967e;
  typesAndConstants2._8_8_ = anon_var_dwarf_969528;
  typesAndConstants2._16_8_ = anon_var_dwarf_969528;
  typesAndConstants2._24_8_ = (long)"False %bool" + 6;
  typesAndConstants2._32_8_ = anon_var_dwarf_969696;
  typesAndConstants2[0x28] = -0x14;
  typesAndConstants2[0x29] = -1;
  typesAndConstants2[0x2a] = -1;
  typesAndConstants2[0x2b] = -1;
  typesAndConstants2[0x2c] = -10;
  typesAndConstants2[0x2d] = -1;
  typesAndConstants2[0x2e] = -1;
  typesAndConstants2[0x2f] = -1;
  typesAndConstants2._48_8_ = selectTrueUsingSc;
  typesAndConstants2._56_8_ = outputColors2._0_8_;
  typesAndConstants2._64_8_ = outputColors2._8_8_;
  if (cases.
      super__Vector_base<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      cases.
      super__Vector_base<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
    ::_M_realloc_insert<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>
              (&cases,(iterator)
                      cases.
                      super__Vector_base<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
                      ._M_impl.super__Vector_impl_data._M_finish,
               (SpecConstantTwoIntGraphicsCase *)typesAndConstants2);
  }
  else {
    pcVar7 = typesAndConstants2;
    pSVar8 = cases.
             super__Vector_base<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (lVar5 = 9; lVar5 != 0; lVar5 = lVar5 + -1) {
      pSVar8->caseName = *(char **)pcVar7;
      pcVar7 = pcVar7 + (ulong)bVar11 * -0x10 + 8;
      pSVar8 = (pointer)((long)pSVar8 + (ulong)bVar11 * -0x10 + 8);
    }
    cases.
    super__Vector_base<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         cases.
         super__Vector_base<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
         ._M_impl.super__Vector_impl_data._M_finish + 1;
  }
  typesAndConstants2._0_8_ = anon_var_dwarf_9696a2;
  typesAndConstants2._8_8_ = anon_var_dwarf_969528;
  typesAndConstants2._16_8_ = anon_var_dwarf_969528;
  typesAndConstants2._24_8_ = (long)"False %bool" + 6;
  typesAndConstants2._32_8_ = anon_var_dwarf_9696ae;
  typesAndConstants2[0x28] = '\n';
  typesAndConstants2[0x29] = '\0';
  typesAndConstants2[0x2a] = '\0';
  typesAndConstants2[0x2b] = '\0';
  typesAndConstants2[0x2c] = '\x14';
  typesAndConstants2[0x2d] = '\0';
  typesAndConstants2[0x2e] = '\0';
  typesAndConstants2[0x2f] = '\0';
  typesAndConstants2._48_8_ = selectTrueUsingSc;
  typesAndConstants2._56_8_ = outputColors2._0_8_;
  typesAndConstants2._64_8_ = outputColors2._8_8_;
  if (cases.
      super__Vector_base<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      cases.
      super__Vector_base<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
    ::_M_realloc_insert<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>
              (&cases,(iterator)
                      cases.
                      super__Vector_base<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
                      ._M_impl.super__Vector_impl_data._M_finish,
               (SpecConstantTwoIntGraphicsCase *)typesAndConstants2);
  }
  else {
    pcVar7 = typesAndConstants2;
    pSVar8 = cases.
             super__Vector_base<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (lVar5 = 9; lVar5 != 0; lVar5 = lVar5 + -1) {
      pSVar8->caseName = *(char **)pcVar7;
      pcVar7 = pcVar7 + (ulong)bVar11 * -0x10 + 8;
      pSVar8 = (pointer)((long)pSVar8 + (ulong)bVar11 * -0x10 + 8);
    }
    cases.
    super__Vector_base<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         cases.
         super__Vector_base<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
         ._M_impl.super__Vector_impl_data._M_finish + 1;
  }
  typesAndConstants2._0_8_ = anon_var_dwarf_9696ba;
  typesAndConstants2._8_8_ = anon_var_dwarf_969528;
  typesAndConstants2._16_8_ = anon_var_dwarf_969528;
  typesAndConstants2._24_8_ = (long)"False %bool" + 6;
  typesAndConstants2._32_8_ = anon_var_dwarf_9696c6;
  typesAndConstants2[0x28] = '\x18';
  typesAndConstants2[0x29] = -4;
  typesAndConstants2[0x2a] = -1;
  typesAndConstants2[0x2b] = -1;
  typesAndConstants2[0x2c] = '2';
  typesAndConstants2[0x2d] = '\0';
  typesAndConstants2[0x2e] = '\0';
  typesAndConstants2[0x2f] = '\0';
  typesAndConstants2._48_8_ = selectFalseUsingSc;
  typesAndConstants2._56_8_ = outputColors2._0_8_;
  typesAndConstants2._64_8_ = outputColors2._8_8_;
  if (cases.
      super__Vector_base<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      cases.
      super__Vector_base<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
    ::_M_realloc_insert<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>
              (&cases,(iterator)
                      cases.
                      super__Vector_base<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
                      ._M_impl.super__Vector_impl_data._M_finish,
               (SpecConstantTwoIntGraphicsCase *)typesAndConstants2);
  }
  else {
    pcVar7 = typesAndConstants2;
    pSVar8 = cases.
             super__Vector_base<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (lVar5 = 9; lVar5 != 0; lVar5 = lVar5 + -1) {
      pSVar8->caseName = *(char **)pcVar7;
      pcVar7 = pcVar7 + (ulong)bVar11 * -0x10 + 8;
      pSVar8 = (pointer)((long)pSVar8 + (ulong)bVar11 * -0x10 + 8);
    }
    cases.
    super__Vector_base<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         cases.
         super__Vector_base<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
         ._M_impl.super__Vector_impl_data._M_finish + 1;
  }
  typesAndConstants2._0_8_ = anon_var_dwarf_9696d2;
  typesAndConstants2._8_8_ = anon_var_dwarf_969528;
  typesAndConstants2._16_8_ = anon_var_dwarf_969528;
  typesAndConstants2._24_8_ = (long)"False %bool" + 6;
  typesAndConstants2._32_8_ = anon_var_dwarf_9696de;
  typesAndConstants2[0x28] = '\n';
  typesAndConstants2[0x29] = '\0';
  typesAndConstants2[0x2a] = '\0';
  typesAndConstants2[0x2b] = '\0';
  typesAndConstants2[0x2c] = '\x05';
  typesAndConstants2[0x2d] = '\0';
  typesAndConstants2[0x2e] = '\0';
  typesAndConstants2[0x2f] = '\0';
  typesAndConstants2._48_8_ = selectTrueUsingSc;
  typesAndConstants2._56_8_ = outputColors2._0_8_;
  typesAndConstants2._64_8_ = outputColors2._8_8_;
  if (cases.
      super__Vector_base<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      cases.
      super__Vector_base<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
    ::_M_realloc_insert<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>
              (&cases,(iterator)
                      cases.
                      super__Vector_base<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
                      ._M_impl.super__Vector_impl_data._M_finish,
               (SpecConstantTwoIntGraphicsCase *)typesAndConstants2);
  }
  else {
    pcVar7 = typesAndConstants2;
    pSVar8 = cases.
             super__Vector_base<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (lVar5 = 9; lVar5 != 0; lVar5 = lVar5 + -1) {
      pSVar8->caseName = *(char **)pcVar7;
      pcVar7 = pcVar7 + (ulong)bVar11 * -0x10 + 8;
      pSVar8 = (pointer)((long)pSVar8 + (ulong)bVar11 * -0x10 + 8);
    }
    cases.
    super__Vector_base<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         cases.
         super__Vector_base<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
         ._M_impl.super__Vector_impl_data._M_finish + 1;
  }
  typesAndConstants2._0_8_ = anon_var_dwarf_9696ea;
  typesAndConstants2._8_8_ = anon_var_dwarf_969528;
  typesAndConstants2._16_8_ = anon_var_dwarf_969528;
  typesAndConstants2._24_8_ = (long)"False %bool" + 6;
  typesAndConstants2._32_8_ = anon_var_dwarf_9696f6;
  typesAndConstants2[0x28] = -10;
  typesAndConstants2[0x29] = -1;
  typesAndConstants2[0x2a] = -1;
  typesAndConstants2[0x2b] = -1;
  typesAndConstants2[0x2c] = -10;
  typesAndConstants2[0x2d] = -1;
  typesAndConstants2[0x2e] = -1;
  typesAndConstants2[0x2f] = -1;
  typesAndConstants2._48_8_ = selectTrueUsingSc;
  typesAndConstants2._56_8_ = outputColors2._0_8_;
  typesAndConstants2._64_8_ = outputColors2._8_8_;
  if (cases.
      super__Vector_base<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      cases.
      super__Vector_base<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
    ::_M_realloc_insert<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>
              (&cases,(iterator)
                      cases.
                      super__Vector_base<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
                      ._M_impl.super__Vector_impl_data._M_finish,
               (SpecConstantTwoIntGraphicsCase *)typesAndConstants2);
  }
  else {
    pcVar7 = typesAndConstants2;
    pSVar8 = cases.
             super__Vector_base<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (lVar5 = 9; lVar5 != 0; lVar5 = lVar5 + -1) {
      pSVar8->caseName = *(char **)pcVar7;
      pcVar7 = pcVar7 + (ulong)bVar11 * -0x10 + 8;
      pSVar8 = (pointer)((long)pSVar8 + (ulong)bVar11 * -0x10 + 8);
    }
    cases.
    super__Vector_base<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         cases.
         super__Vector_base<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
         ._M_impl.super__Vector_impl_data._M_finish + 1;
  }
  typesAndConstants2._0_8_ = anon_var_dwarf_969702;
  typesAndConstants2._8_8_ = anon_var_dwarf_969528;
  typesAndConstants2._16_8_ = anon_var_dwarf_969528;
  typesAndConstants2._24_8_ = (long)"False %bool" + 6;
  typesAndConstants2._32_8_ = anon_var_dwarf_96970e;
  typesAndConstants2[0x28] = '2';
  typesAndConstants2[0x29] = '\0';
  typesAndConstants2[0x2a] = '\0';
  typesAndConstants2[0x2b] = '\0';
  typesAndConstants2[0x2c] = 'd';
  typesAndConstants2[0x2d] = '\0';
  typesAndConstants2[0x2e] = '\0';
  typesAndConstants2[0x2f] = '\0';
  typesAndConstants2._48_8_ = selectTrueUsingSc;
  typesAndConstants2._56_8_ = outputColors2._0_8_;
  typesAndConstants2._64_8_ = outputColors2._8_8_;
  if (cases.
      super__Vector_base<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      cases.
      super__Vector_base<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
    ::_M_realloc_insert<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>
              (&cases,(iterator)
                      cases.
                      super__Vector_base<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
                      ._M_impl.super__Vector_impl_data._M_finish,
               (SpecConstantTwoIntGraphicsCase *)typesAndConstants2);
  }
  else {
    pcVar7 = typesAndConstants2;
    pSVar8 = cases.
             super__Vector_base<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (lVar5 = 9; lVar5 != 0; lVar5 = lVar5 + -1) {
      pSVar8->caseName = *(char **)pcVar7;
      pcVar7 = pcVar7 + (ulong)bVar11 * -0x10 + 8;
      pSVar8 = (pointer)((long)pSVar8 + (ulong)bVar11 * -0x10 + 8);
    }
    cases.
    super__Vector_base<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         cases.
         super__Vector_base<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
         ._M_impl.super__Vector_impl_data._M_finish + 1;
  }
  typesAndConstants2._0_8_ = anon_var_dwarf_96971a;
  typesAndConstants2._8_8_ = anon_var_dwarf_969528;
  typesAndConstants2._16_8_ = anon_var_dwarf_969528;
  typesAndConstants2._24_8_ = (long)"False %bool" + 6;
  typesAndConstants2._32_8_ = anon_var_dwarf_969726;
  typesAndConstants2[0x28] = '\x18';
  typesAndConstants2[0x29] = -4;
  typesAndConstants2[0x2a] = -1;
  typesAndConstants2[0x2b] = -1;
  typesAndConstants2[0x2c] = '2';
  typesAndConstants2[0x2d] = '\0';
  typesAndConstants2[0x2e] = '\0';
  typesAndConstants2[0x2f] = '\0';
  typesAndConstants2._48_8_ = selectFalseUsingSc;
  typesAndConstants2._56_8_ = outputColors2._0_8_;
  typesAndConstants2._64_8_ = outputColors2._8_8_;
  if (cases.
      super__Vector_base<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      cases.
      super__Vector_base<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
    ::_M_realloc_insert<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>
              (&cases,(iterator)
                      cases.
                      super__Vector_base<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
                      ._M_impl.super__Vector_impl_data._M_finish,
               (SpecConstantTwoIntGraphicsCase *)typesAndConstants2);
  }
  else {
    pcVar7 = typesAndConstants2;
    pSVar8 = cases.
             super__Vector_base<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (lVar5 = 9; lVar5 != 0; lVar5 = lVar5 + -1) {
      pSVar8->caseName = *(char **)pcVar7;
      pcVar7 = pcVar7 + (ulong)bVar11 * -0x10 + 8;
      pSVar8 = (pointer)((long)pSVar8 + (ulong)bVar11 * -0x10 + 8);
    }
    cases.
    super__Vector_base<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         cases.
         super__Vector_base<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
         ._M_impl.super__Vector_impl_data._M_finish + 1;
  }
  typesAndConstants2._0_8_ = anon_var_dwarf_969732;
  typesAndConstants2._8_8_ = anon_var_dwarf_969528;
  typesAndConstants2._16_8_ = anon_var_dwarf_969528;
  typesAndConstants2._24_8_ = (long)"False %bool" + 6;
  typesAndConstants2._32_8_ = anon_var_dwarf_96973e;
  typesAndConstants2[0x28] = '\n';
  typesAndConstants2[0x29] = '\0';
  typesAndConstants2[0x2a] = '\0';
  typesAndConstants2[0x2b] = '\0';
  typesAndConstants2[0x2c] = '\n';
  typesAndConstants2[0x2d] = '\0';
  typesAndConstants2[0x2e] = '\0';
  typesAndConstants2[0x2f] = '\0';
  typesAndConstants2._48_8_ = selectTrueUsingSc;
  typesAndConstants2._56_8_ = outputColors2._0_8_;
  typesAndConstants2._64_8_ = outputColors2._8_8_;
  if (cases.
      super__Vector_base<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      cases.
      super__Vector_base<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
    ::_M_realloc_insert<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>
              (&cases,(iterator)
                      cases.
                      super__Vector_base<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
                      ._M_impl.super__Vector_impl_data._M_finish,
               (SpecConstantTwoIntGraphicsCase *)typesAndConstants2);
  }
  else {
    pcVar7 = typesAndConstants2;
    pSVar8 = cases.
             super__Vector_base<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (lVar5 = 9; lVar5 != 0; lVar5 = lVar5 + -1) {
      pSVar8->caseName = *(char **)pcVar7;
      pcVar7 = pcVar7 + (ulong)bVar11 * -0x10 + 8;
      pSVar8 = (pointer)((long)pSVar8 + (ulong)bVar11 * -0x10 + 8);
    }
    cases.
    super__Vector_base<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         cases.
         super__Vector_base<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
         ._M_impl.super__Vector_impl_data._M_finish + 1;
  }
  typesAndConstants2._0_8_ = anon_var_dwarf_96974a;
  typesAndConstants2._8_8_ = anon_var_dwarf_969528;
  typesAndConstants2._16_8_ = anon_var_dwarf_969528;
  typesAndConstants2._24_8_ = (long)"False %bool" + 6;
  typesAndConstants2._32_8_ = anon_var_dwarf_969756;
  typesAndConstants2[0x28] = '*';
  typesAndConstants2[0x29] = '\0';
  typesAndConstants2[0x2a] = '\0';
  typesAndConstants2[0x2b] = '\0';
  typesAndConstants2[0x2c] = '\x18';
  typesAndConstants2[0x2d] = '\0';
  typesAndConstants2[0x2e] = '\0';
  typesAndConstants2[0x2f] = '\0';
  typesAndConstants2._48_8_ = selectFalseUsingSc;
  typesAndConstants2._56_8_ = outputColors2._0_8_;
  typesAndConstants2._64_8_ = outputColors2._8_8_;
  if (cases.
      super__Vector_base<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      cases.
      super__Vector_base<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
    ::_M_realloc_insert<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>
              (&cases,(iterator)
                      cases.
                      super__Vector_base<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
                      ._M_impl.super__Vector_impl_data._M_finish,
               (SpecConstantTwoIntGraphicsCase *)typesAndConstants2);
  }
  else {
    pcVar7 = typesAndConstants2;
    pSVar8 = cases.
             super__Vector_base<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (lVar5 = 9; lVar5 != 0; lVar5 = lVar5 + -1) {
      pSVar8->caseName = *(char **)pcVar7;
      pcVar7 = pcVar7 + (ulong)bVar11 * -0x10 + 8;
      pSVar8 = (pointer)((long)pSVar8 + (ulong)bVar11 * -0x10 + 8);
    }
    cases.
    super__Vector_base<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         cases.
         super__Vector_base<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
         ._M_impl.super__Vector_impl_data._M_finish + 1;
  }
  typesAndConstants2._0_8_ = anon_var_dwarf_969762;
  typesAndConstants2._8_8_ = anon_var_dwarf_96976e;
  typesAndConstants2._16_8_ = anon_var_dwarf_96976e;
  typesAndConstants2._24_8_ = (long)"False %bool" + 6;
  typesAndConstants2._32_8_ = anon_var_dwarf_96977a;
  typesAndConstants2[0x28] = '\0';
  typesAndConstants2[0x29] = '\0';
  typesAndConstants2[0x2a] = '\0';
  typesAndConstants2[0x2b] = '\0';
  typesAndConstants2[0x2c] = '\x01';
  typesAndConstants2[0x2d] = '\0';
  typesAndConstants2[0x2e] = '\0';
  typesAndConstants2[0x2f] = '\0';
  typesAndConstants2._48_8_ = selectFalseUsingSc;
  typesAndConstants2._56_8_ = outputColors2._0_8_;
  typesAndConstants2._64_8_ = outputColors2._8_8_;
  if (cases.
      super__Vector_base<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      cases.
      super__Vector_base<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
    ::_M_realloc_insert<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>
              (&cases,(iterator)
                      cases.
                      super__Vector_base<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
                      ._M_impl.super__Vector_impl_data._M_finish,
               (SpecConstantTwoIntGraphicsCase *)typesAndConstants2);
  }
  else {
    pcVar7 = typesAndConstants2;
    pSVar8 = cases.
             super__Vector_base<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (lVar5 = 9; lVar5 != 0; lVar5 = lVar5 + -1) {
      pSVar8->caseName = *(char **)pcVar7;
      pcVar7 = pcVar7 + (ulong)bVar11 * -0x10 + 8;
      pSVar8 = (pointer)((long)pSVar8 + (ulong)bVar11 * -0x10 + 8);
    }
    cases.
    super__Vector_base<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         cases.
         super__Vector_base<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
         ._M_impl.super__Vector_impl_data._M_finish + 1;
  }
  typesAndConstants2._0_8_ = anon_var_dwarf_969786;
  typesAndConstants2._8_8_ = anon_var_dwarf_969792;
  typesAndConstants2._16_8_ = anon_var_dwarf_969792;
  typesAndConstants2._24_8_ = (long)"False %bool" + 6;
  typesAndConstants2._32_8_ = anon_var_dwarf_9697aa;
  typesAndConstants2[0x28] = '\x01';
  typesAndConstants2[0x29] = '\0';
  typesAndConstants2[0x2a] = '\0';
  typesAndConstants2[0x2b] = '\0';
  typesAndConstants2[0x2c] = '\0';
  typesAndConstants2[0x2d] = '\0';
  typesAndConstants2[0x2e] = '\0';
  typesAndConstants2[0x2f] = '\0';
  typesAndConstants2._48_8_ = selectTrueUsingSc;
  typesAndConstants2._56_8_ = outputColors2._0_8_;
  typesAndConstants2._64_8_ = outputColors2._8_8_;
  if (cases.
      super__Vector_base<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      cases.
      super__Vector_base<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
    ::_M_realloc_insert<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>
              (&cases,(iterator)
                      cases.
                      super__Vector_base<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
                      ._M_impl.super__Vector_impl_data._M_finish,
               (SpecConstantTwoIntGraphicsCase *)typesAndConstants2);
  }
  else {
    pcVar7 = typesAndConstants2;
    pSVar8 = cases.
             super__Vector_base<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (lVar5 = 9; lVar5 != 0; lVar5 = lVar5 + -1) {
      pSVar8->caseName = *(char **)pcVar7;
      pcVar7 = pcVar7 + (ulong)bVar11 * -0x10 + 8;
      pSVar8 = (pointer)((long)pSVar8 + (ulong)bVar11 * -0x10 + 8);
    }
    cases.
    super__Vector_base<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         cases.
         super__Vector_base<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
         ._M_impl.super__Vector_impl_data._M_finish + 1;
  }
  typesAndConstants2._0_8_ = anon_var_dwarf_9697b6;
  typesAndConstants2._8_8_ = anon_var_dwarf_96976e;
  typesAndConstants2._16_8_ = anon_var_dwarf_96976e;
  typesAndConstants2._24_8_ = (long)"False %bool" + 6;
  typesAndConstants2._32_8_ = anon_var_dwarf_9697c2;
  typesAndConstants2[0x28] = '\0';
  typesAndConstants2[0x29] = '\0';
  typesAndConstants2[0x2a] = '\0';
  typesAndConstants2[0x2b] = '\0';
  typesAndConstants2[0x2c] = '\x01';
  typesAndConstants2[0x2d] = '\0';
  typesAndConstants2[0x2e] = '\0';
  typesAndConstants2[0x2f] = '\0';
  typesAndConstants2._48_8_ = selectFalseUsingSc;
  typesAndConstants2._56_8_ = outputColors2._0_8_;
  typesAndConstants2._64_8_ = outputColors2._8_8_;
  if (cases.
      super__Vector_base<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      cases.
      super__Vector_base<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
    ::_M_realloc_insert<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>
              (&cases,(iterator)
                      cases.
                      super__Vector_base<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
                      ._M_impl.super__Vector_impl_data._M_finish,
               (SpecConstantTwoIntGraphicsCase *)typesAndConstants2);
  }
  else {
    pcVar7 = typesAndConstants2;
    pSVar8 = cases.
             super__Vector_base<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (lVar5 = 9; lVar5 != 0; lVar5 = lVar5 + -1) {
      pSVar8->caseName = *(char **)pcVar7;
      pcVar7 = pcVar7 + (ulong)bVar11 * -0x10 + 8;
      pSVar8 = (pointer)((long)pSVar8 + (ulong)bVar11 * -0x10 + 8);
    }
    cases.
    super__Vector_base<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         cases.
         super__Vector_base<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
         ._M_impl.super__Vector_impl_data._M_finish + 1;
  }
  typesAndConstants2._0_8_ = anon_var_dwarf_9697ce;
  typesAndConstants2._8_8_ = anon_var_dwarf_969792;
  typesAndConstants2._16_8_ = anon_var_dwarf_969792;
  typesAndConstants2._24_8_ = (long)"False %bool" + 6;
  typesAndConstants2._32_8_ = anon_var_dwarf_9697da;
  typesAndConstants2[0x28] = '\x01';
  typesAndConstants2[0x29] = '\0';
  typesAndConstants2[0x2a] = '\0';
  typesAndConstants2[0x2b] = '\0';
  typesAndConstants2[0x2c] = '\0';
  typesAndConstants2[0x2d] = '\0';
  typesAndConstants2[0x2e] = '\0';
  typesAndConstants2[0x2f] = '\0';
  typesAndConstants2._48_8_ = selectTrueUsingSc;
  typesAndConstants2._56_8_ = outputColors2._0_8_;
  typesAndConstants2._64_8_ = outputColors2._8_8_;
  if (cases.
      super__Vector_base<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      cases.
      super__Vector_base<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
    ::_M_realloc_insert<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>
              (&cases,(iterator)
                      cases.
                      super__Vector_base<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
                      ._M_impl.super__Vector_impl_data._M_finish,
               (SpecConstantTwoIntGraphicsCase *)typesAndConstants2);
  }
  else {
    pcVar7 = typesAndConstants2;
    pSVar8 = cases.
             super__Vector_base<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (lVar5 = 9; lVar5 != 0; lVar5 = lVar5 + -1) {
      pSVar8->caseName = *(char **)pcVar7;
      pcVar7 = pcVar7 + (ulong)bVar11 * -0x10 + 8;
      pSVar8 = (pointer)((long)pSVar8 + (ulong)bVar11 * -0x10 + 8);
    }
    cases.
    super__Vector_base<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         cases.
         super__Vector_base<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
         ._M_impl.super__Vector_impl_data._M_finish + 1;
  }
  typesAndConstants2._0_8_ = anon_var_dwarf_9697e6;
  typesAndConstants2._8_8_ = anon_var_dwarf_969528;
  typesAndConstants2._16_8_ = anon_var_dwarf_969528;
  typesAndConstants2._24_8_ = (long)"%type = OpTypePointer Function %i32" + 0x1f;
  typesAndConstants2._32_8_ = anon_var_dwarf_9697f2;
  typesAndConstants2[0x28] = -1;
  typesAndConstants2[0x29] = -1;
  typesAndConstants2[0x2a] = -1;
  typesAndConstants2[0x2b] = -1;
  typesAndConstants2[0x2c] = '\0';
  typesAndConstants2[0x2d] = '\0';
  typesAndConstants2[0x2e] = '\0';
  typesAndConstants2[0x2f] = '\0';
  typesAndConstants2._48_8_ = addZeroToSc;
  typesAndConstants2._56_8_ = outputColors2._0_8_;
  typesAndConstants2._64_8_ = outputColors2._8_8_;
  if (cases.
      super__Vector_base<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      cases.
      super__Vector_base<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
    ::_M_realloc_insert<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>
              (&cases,(iterator)
                      cases.
                      super__Vector_base<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
                      ._M_impl.super__Vector_impl_data._M_finish,
               (SpecConstantTwoIntGraphicsCase *)typesAndConstants2);
  }
  else {
    pcVar7 = typesAndConstants2;
    pSVar8 = cases.
             super__Vector_base<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (lVar5 = 9; lVar5 != 0; lVar5 = lVar5 + -1) {
      pSVar8->caseName = *(char **)pcVar7;
      pcVar7 = pcVar7 + (ulong)bVar11 * -0x10 + 8;
      pSVar8 = (pointer)((long)pSVar8 + (ulong)bVar11 * -0x10 + 8);
    }
    cases.
    super__Vector_base<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         cases.
         super__Vector_base<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
         ._M_impl.super__Vector_impl_data._M_finish + 1;
  }
  typesAndConstants2._0_8_ = (long)"multiViewport is supported but geometryShader is not" + 0x31;
  typesAndConstants2._8_8_ = anon_var_dwarf_969528;
  typesAndConstants2._16_8_ = anon_var_dwarf_969528;
  typesAndConstants2._24_8_ = (long)"%type = OpTypePointer Function %i32" + 0x1f;
  typesAndConstants2._32_8_ = anon_var_dwarf_96980a;
  typesAndConstants2[0x28] = -2;
  typesAndConstants2[0x29] = -1;
  typesAndConstants2[0x2a] = -1;
  typesAndConstants2[0x2b] = -1;
  typesAndConstants2[0x2c] = '\0';
  typesAndConstants2[0x2d] = '\0';
  typesAndConstants2[0x2e] = '\0';
  typesAndConstants2[0x2f] = '\0';
  typesAndConstants2._48_8_ = addZeroToSc;
  typesAndConstants2._56_8_ = outputColors2._0_8_;
  typesAndConstants2._64_8_ = outputColors2._8_8_;
  if (cases.
      super__Vector_base<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      cases.
      super__Vector_base<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
    ::_M_realloc_insert<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>
              (&cases,(iterator)
                      cases.
                      super__Vector_base<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
                      ._M_impl.super__Vector_impl_data._M_finish,
               (SpecConstantTwoIntGraphicsCase *)typesAndConstants2);
  }
  else {
    pcVar7 = typesAndConstants2;
    pSVar8 = cases.
             super__Vector_base<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (lVar5 = 9; lVar5 != 0; lVar5 = lVar5 + -1) {
      pSVar8->caseName = *(char **)pcVar7;
      pcVar7 = pcVar7 + (ulong)bVar11 * -0x10 + 8;
      pSVar8 = (pointer)((long)pSVar8 + (ulong)bVar11 * -0x10 + 8);
    }
    cases.
    super__Vector_base<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         cases.
         super__Vector_base<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
         ._M_impl.super__Vector_impl_data._M_finish + 1;
  }
  typesAndConstants2._0_8_ = anon_var_dwarf_969816;
  typesAndConstants2._8_8_ = anon_var_dwarf_969792;
  typesAndConstants2._16_8_ = anon_var_dwarf_969792;
  typesAndConstants2._24_8_ = (long)"False %bool" + 6;
  typesAndConstants2._32_8_ = anon_var_dwarf_969822;
  typesAndConstants2[0x28] = '\x01';
  typesAndConstants2[0x29] = '\0';
  typesAndConstants2[0x2a] = '\0';
  typesAndConstants2[0x2b] = '\0';
  typesAndConstants2[0x2c] = '\0';
  typesAndConstants2[0x2d] = '\0';
  typesAndConstants2[0x2e] = '\0';
  typesAndConstants2[0x2f] = '\0';
  typesAndConstants2._48_8_ = selectFalseUsingSc;
  typesAndConstants2._56_8_ = outputColors2._0_8_;
  typesAndConstants2._64_8_ = outputColors2._8_8_;
  if (cases.
      super__Vector_base<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      cases.
      super__Vector_base<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
    ::_M_realloc_insert<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>
              (&cases,(iterator)
                      cases.
                      super__Vector_base<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
                      ._M_impl.super__Vector_impl_data._M_finish,
               (SpecConstantTwoIntGraphicsCase *)typesAndConstants2);
  }
  else {
    pcVar7 = typesAndConstants2;
    pSVar8 = cases.
             super__Vector_base<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (lVar5 = 9; lVar5 != 0; lVar5 = lVar5 + -1) {
      pSVar8->caseName = *(char **)pcVar7;
      pcVar7 = pcVar7 + (ulong)bVar11 * -0x10 + 8;
      pSVar8 = (pointer)((long)pSVar8 + (ulong)bVar11 * -0x10 + 8);
    }
    cases.
    super__Vector_base<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         cases.
         super__Vector_base<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
         ._M_impl.super__Vector_impl_data._M_finish + 1;
  }
  typesAndConstants2._0_8_ = anon_var_dwarf_96982e;
  typesAndConstants2._8_8_ = anon_var_dwarf_969792;
  typesAndConstants2._16_8_ = anon_var_dwarf_969528;
  typesAndConstants2._24_8_ = (long)"%type = OpTypePointer Function %i32" + 0x1f;
  typesAndConstants2._32_8_ = anon_var_dwarf_96983a;
  typesAndConstants2[0x28] = '\x01';
  typesAndConstants2[0x29] = '\0';
  typesAndConstants2[0x2a] = '\0';
  typesAndConstants2[0x2b] = '\0';
  typesAndConstants2[0x2c] = '\x01';
  typesAndConstants2[0x2d] = '\0';
  typesAndConstants2[0x2e] = '\0';
  typesAndConstants2[0x2f] = '\0';
  typesAndConstants2._48_8_ = addZeroToSc;
  typesAndConstants2._56_8_ = outputColors2._0_8_;
  typesAndConstants2._64_8_ = outputColors2._8_8_;
  if (cases.
      super__Vector_base<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      cases.
      super__Vector_base<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
    ::_M_realloc_insert<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>
              (&cases,(iterator)
                      cases.
                      super__Vector_base<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
                      ._M_impl.super__Vector_impl_data._M_finish,
               (SpecConstantTwoIntGraphicsCase *)typesAndConstants2);
  }
  else {
    pcVar7 = typesAndConstants2;
    pSVar8 = cases.
             super__Vector_base<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (lVar5 = 9; lVar5 != 0; lVar5 = lVar5 + -1) {
      pSVar8->caseName = *(char **)pcVar7;
      pcVar7 = pcVar7 + (ulong)bVar11 * -0x10 + 8;
      pSVar8 = (pointer)((long)pSVar8 + (ulong)bVar11 * -0x10 + 8);
    }
    cases.
    super__Vector_base<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         cases.
         super__Vector_base<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
         ._M_impl.super__Vector_impl_data._M_finish + 1;
  }
  if (cases.
      super__Vector_base<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      cases.
      super__Vector_base<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    paVar1 = &local_b40.field_2;
    lVar5 = 0;
    uVar10 = 0;
    do {
      typesAndConstants2._8_8_ = typesAndConstants2._8_8_ & 0xffffffff00000000;
      typesAndConstants2[0x10] = '\0';
      typesAndConstants2[0x11] = '\0';
      typesAndConstants2[0x12] = '\0';
      typesAndConstants2[0x13] = '\0';
      typesAndConstants2[0x14] = '\0';
      typesAndConstants2[0x15] = '\0';
      typesAndConstants2[0x16] = '\0';
      typesAndConstants2[0x17] = '\0';
      typesAndConstants2._24_8_ = typesAndConstants2 + 8;
      typesAndConstants2[0x28] = '\0';
      typesAndConstants2[0x29] = '\0';
      typesAndConstants2[0x2a] = '\0';
      typesAndConstants2[0x2b] = '\0';
      typesAndConstants2[0x2c] = '\0';
      typesAndConstants2[0x2d] = '\0';
      typesAndConstants2[0x2e] = '\0';
      typesAndConstants2[0x2f] = '\0';
      function2[8] = '\0';
      function2[9] = '\0';
      function2[10] = '\0';
      function2[0xb] = '\0';
      function2[0x10] = '\0';
      function2[0x11] = '\0';
      function2[0x12] = '\0';
      function2[0x13] = '\0';
      function2[0x14] = '\0';
      function2[0x15] = '\0';
      function2[0x16] = '\0';
      function2[0x17] = '\0';
      function2._24_8_ = function2 + 8;
      function2[0x28] = '\0';
      function2[0x29] = '\0';
      function2[0x2a] = '\0';
      function2[0x2b] = '\0';
      function2[0x2c] = '\0';
      function2[0x2d] = '\0';
      function2[0x2e] = '\0';
      function2[0x2f] = '\0';
      specConstants.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      specConstants.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      specConstants.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      pcVar7 = *(char **)((long)((cases.
                                  super__Vector_base<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->expectedColors + -0xc)
                         + lVar5);
      decorations2._0_8_ = decorations2 + 0x10;
      typesAndConstants2._32_8_ = typesAndConstants2._24_8_;
      function2._32_8_ = function2._24_8_;
      std::__cxx11::string::_M_construct<char_const*>((string *)decorations2,"SC_DEF0","");
      pmVar3 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)typesAndConstants2,(string *)decorations2);
      pcVar9 = (char *)pmVar3->_M_string_length;
      strlen(pcVar7);
      std::__cxx11::string::_M_replace((ulong)pmVar3,0,pcVar9,(ulong)pcVar7);
      if ((char *)decorations2._0_8_ != decorations2 + 0x10) {
        operator_delete((void *)decorations2._0_8_,decorations2._16_8_ + 1);
      }
      pcVar7 = *(char **)((long)((cases.
                                  super__Vector_base<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->expectedColors + -10)
                         + lVar5);
      decorations2._0_8_ = decorations2 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)decorations2,"SC_DEF1","");
      pmVar3 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)typesAndConstants2,(string *)decorations2);
      pcVar9 = (char *)pmVar3->_M_string_length;
      strlen(pcVar7);
      std::__cxx11::string::_M_replace((ulong)pmVar3,0,pcVar9,(ulong)pcVar7);
      if ((char *)decorations2._0_8_ != decorations2 + 0x10) {
        operator_delete((void *)decorations2._0_8_,decorations2._16_8_ + 1);
      }
      pcVar7 = *(char **)((long)((cases.
                                  super__Vector_base<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->expectedColors + -8) +
                         lVar5);
      decorations2._0_8_ = decorations2 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)decorations2,"SC_RESULT_TYPE","");
      pmVar3 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)typesAndConstants2,(string *)decorations2);
      pcVar9 = (char *)pmVar3->_M_string_length;
      strlen(pcVar7);
      std::__cxx11::string::_M_replace((ulong)pmVar3,0,pcVar9,(ulong)pcVar7);
      if ((char *)decorations2._0_8_ != decorations2 + 0x10) {
        operator_delete((void *)decorations2._0_8_,decorations2._16_8_ + 1);
      }
      pcVar7 = *(char **)((long)((cases.
                                  super__Vector_base<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->expectedColors + -6) +
                         lVar5);
      decorations2._0_8_ = decorations2 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)decorations2,"SC_OP","");
      pmVar3 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)typesAndConstants2,(string *)decorations2);
      pcVar9 = (char *)pmVar3->_M_string_length;
      strlen(pcVar7);
      std::__cxx11::string::_M_replace((ulong)pmVar3,0,pcVar9,(ulong)pcVar7);
      if ((char *)decorations2._0_8_ != decorations2 + 0x10) {
        operator_delete((void *)decorations2._0_8_,decorations2._16_8_ + 1);
      }
      pcVar7 = *(char **)((long)((cases.
                                  super__Vector_base<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->expectedColors + -2) +
                         lVar5);
      decorations2._0_8_ = decorations2 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)decorations2,"GEN_RESULT","");
      pmVar3 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)typesAndConstants2,(string *)decorations2);
      pcVar9 = (char *)pmVar3->_M_string_length;
      strlen(pcVar7);
      std::__cxx11::string::_M_replace((ulong)pmVar3,0,pcVar9,(ulong)pcVar7);
      if ((char *)decorations2._0_8_ != decorations2 + 0x10) {
        operator_delete((void *)decorations2._0_8_,decorations2._16_8_ + 1);
      }
      local_bd8._M_dataplus._M_p = (pointer)&local_bd8.field_2;
      sVar4 = strlen(decorations1);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_bd8,decorations1,decorations1 + sVar4);
      tcu::StringTemplate::StringTemplate((StringTemplate *)&fragments,&local_bd8);
      tcu::StringTemplate::specialize
                ((string *)decorations2,(StringTemplate *)&fragments,
                 (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)typesAndConstants2);
      local_b40._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_b40,"decoration","");
      pmVar3 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)function2,&local_b40);
      std::__cxx11::string::operator=((string *)pmVar3,(string *)decorations2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b40._M_dataplus._M_p != paVar1) {
        operator_delete(local_b40._M_dataplus._M_p,
                        CONCAT71(local_b40.field_2._M_allocated_capacity._1_7_,
                                 local_b40.field_2._M_local_buf[0]) + 1);
      }
      if ((char *)decorations2._0_8_ != decorations2 + 0x10) {
        operator_delete((void *)decorations2._0_8_,decorations2._16_8_ + 1);
      }
      tcu::StringTemplate::~StringTemplate((StringTemplate *)&fragments);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_bd8._M_dataplus._M_p != &local_bd8.field_2) {
        operator_delete(local_bd8._M_dataplus._M_p,local_bd8.field_2._M_allocated_capacity + 1);
      }
      local_bd8._M_dataplus._M_p = (pointer)&local_bd8.field_2;
      sVar4 = strlen(typesAndConstants1);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_bd8,typesAndConstants1,typesAndConstants1 + sVar4);
      tcu::StringTemplate::StringTemplate((StringTemplate *)&fragments,&local_bd8);
      tcu::StringTemplate::specialize
                ((string *)decorations2,(StringTemplate *)&fragments,
                 (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)typesAndConstants2);
      local_b40._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_b40,"pre_main","");
      pmVar3 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)function2,&local_b40);
      std::__cxx11::string::operator=((string *)pmVar3,(string *)decorations2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b40._M_dataplus._M_p != paVar1) {
        operator_delete(local_b40._M_dataplus._M_p,
                        CONCAT71(local_b40.field_2._M_allocated_capacity._1_7_,
                                 local_b40.field_2._M_local_buf[0]) + 1);
      }
      if ((char *)decorations2._0_8_ != decorations2 + 0x10) {
        operator_delete((void *)decorations2._0_8_,decorations2._16_8_ + 1);
      }
      tcu::StringTemplate::~StringTemplate((StringTemplate *)&fragments);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_bd8._M_dataplus._M_p != &local_bd8.field_2) {
        operator_delete(local_bd8._M_dataplus._M_p,local_bd8.field_2._M_allocated_capacity + 1);
      }
      local_bd8._M_dataplus._M_p = (pointer)&local_bd8.field_2;
      sVar4 = strlen(function1);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_bd8,function1,function1 + sVar4);
      tcu::StringTemplate::StringTemplate((StringTemplate *)&fragments,&local_bd8);
      tcu::StringTemplate::specialize
                ((string *)decorations2,(StringTemplate *)&fragments,
                 (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)typesAndConstants2);
      local_b40._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_b40,"testfun","");
      pmVar3 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)function2,&local_b40);
      std::__cxx11::string::operator=((string *)pmVar3,(string *)decorations2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b40._M_dataplus._M_p != paVar1) {
        operator_delete(local_b40._M_dataplus._M_p,
                        CONCAT71(local_b40.field_2._M_allocated_capacity._1_7_,
                                 local_b40.field_2._M_local_buf[0]) + 1);
      }
      if ((char *)decorations2._0_8_ != decorations2 + 0x10) {
        operator_delete((void *)decorations2._0_8_,decorations2._16_8_ + 1);
      }
      tcu::StringTemplate::~StringTemplate((StringTemplate *)&fragments);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_bd8._M_dataplus._M_p != &local_bd8.field_2) {
        operator_delete(local_bd8._M_dataplus._M_p,local_bd8.field_2._M_allocated_capacity + 1);
      }
      piVar6 = (int *)((long)((cases.
                               super__Vector_base<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
                               ._M_impl.super__Vector_impl_data._M_start)->expectedColors + -4) +
                      lVar5);
      if (specConstants.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          specConstants.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  ((vector<int,std::allocator<int>> *)&specConstants,
                   (iterator)
                   specConstants.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish,piVar6);
      }
      else {
        *specConstants.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
         ._M_finish = *piVar6;
        specConstants.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = specConstants.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish + 1;
      }
      piVar6 = (int *)((long)((cases.
                               super__Vector_base<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
                               ._M_impl.super__Vector_impl_data._M_start)->expectedColors + -3) +
                      lVar5);
      if (specConstants.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          specConstants.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  ((vector<int,std::allocator<int>> *)&specConstants,
                   (iterator)
                   specConstants.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish,piVar6);
      }
      else {
        *specConstants.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
         ._M_finish = *piVar6;
        specConstants.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = specConstants.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish + 1;
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)decorations2,
                 *(char **)((long)&((SpecConstantTwoIntGraphicsCase *)
                                   ((cases.
                                     super__Vector_base<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->expectedColors +
                                   -0xe))->caseName + lVar5),(allocator<char> *)&local_bd8);
      pp_Var2 = &fragments._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      fragments._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      fragments._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
      fragments._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           (_Base_ptr)
           ((ulong)fragments._M_t._M_impl.super__Rb_tree_header._M_header._M_parent &
           0xffffffffffffff00);
      fragments._M_t._M_impl._0_8_ = pp_Var2;
      createTestsForAllStages
                ((string *)decorations2,&inputColors,
                 (RGBA (*) [4])
                 ((long)&(cases.
                          super__Vector_base<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
                          ._M_impl.super__Vector_impl_data._M_start)->expectedColors[0].m_value +
                 lVar5),(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)function2,&specConstants,local_b20,QP_TEST_RESULT_FAIL,
                 (string *)&fragments);
      if ((_Base_ptr *)fragments._M_t._M_impl._0_8_ != pp_Var2) {
        operator_delete((void *)fragments._M_t._M_impl._0_8_,
                        (ulong)((long)&(fragments._M_t._M_impl.super__Rb_tree_header._M_header.
                                       _M_parent)->_M_color + 1));
      }
      if ((char *)decorations2._0_8_ != decorations2 + 0x10) {
        operator_delete((void *)decorations2._0_8_,decorations2._16_8_ + 1);
      }
      if (specConstants.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(specConstants.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)specConstants.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)specConstants.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)function2);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)typesAndConstants2);
      uVar10 = uVar10 + 1;
      lVar5 = lVar5 + 0x48;
    } while (uVar10 < (ulong)(((long)cases.
                                     super__Vector_base<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)cases.
                                     super__Vector_base<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 3) *
                             -0x71c71c71c71c71c7));
  }
  pcVar7 = "OpDecorate %sc_0  SpecId 0\nOpDecorate %sc_1  SpecId 1\nOpDecorate %sc_2  SpecId 2\n";
  pcVar9 = decorations2;
  for (lVar5 = 10; lVar5 != 0; lVar5 = lVar5 + -1) {
    *(undefined8 *)pcVar9 = *(undefined8 *)pcVar7;
    pcVar7 = pcVar7 + ((ulong)bVar11 * -2 + 1) * 8;
    pcVar9 = pcVar9 + (ulong)bVar11 * -0x10 + 8;
  }
  decorations2[0x50] = '\n';
  decorations2[0x51] = '\0';
  memcpy(typesAndConstants2,
         "%v3i32       = OpTypeVector %i32 3\n%vec3_0      = OpConstantComposite %v3i32 %c_i32_0 %c_i32_0 %c_i32_0\n%vec3_undef  = OpUndef %v3i32\n%sc_0        = OpSpecConstant %i32 0\n%sc_1        = OpSpecConstant %i32 0\n%sc_2        = OpSpecConstant %i32 0\n%sc_vec3_0   = OpSpecConstantOp %v3i32 CompositeInsert  %sc_0        %vec3_0      0\n%sc_vec3_1   = OpSpecConstantOp %v3i32 CompositeInsert  %sc_1        %vec3_0      1\n%sc_vec3_2   = OpSpecConstantOp %v3i32 CompositeInsert  %sc_2        %vec3_0      2\n%sc_vec3_0_s = OpSpecConstantOp %v3i32 VectorShuffle    %sc_vec3_0   %vec3_undef  0          0xFFFFFFFF 2\n%sc_vec3_1_s = OpSpecConstantOp %v3i32 VectorShuffle    %sc_vec3_1   %vec3_undef  0xFFFFFFFF 1          0\n%sc_vec3_2_s = OpSpecConstantOp %v3i32 VectorShuffle    %vec3_undef  %sc_vec3_2   5          0xFFFFFFFF 5\n%sc_vec3_01  = OpSpecConstantOp %v3i32 VectorShuffle    %sc_vec3_0_s %sc_vec3_1_s 1 0 4\n%sc_vec3_012 = OpSpecConstantOp %v3i32 VectorShuffle    %sc_vec3_01  %sc_vec3_2_s 5 1 2\n%sc_ext_0    = OpSpecConstantOp %i32   CompositeExtract %sc_vec3_012              0\n%sc_ext_1    = OpSpecConstantOp %i32   CompositeExtract %sc_vec3_012              1\n%sc_ext_2    = OpSpecConstantOp %i32   CompositeExtract %sc_vec3_012              2\n%sc_sub      = OpSpecConstantOp %i32   ISub             %sc_ext_0    %sc_ext_1\n%sc_final    = OpSpecConstantOp %i32   IMul             %sc_sub      %sc_ext_2\n"
         ,0x57a);
  memcpy(function2,
         "%test_code = OpFunction %v4f32 None %v4f32_function\n%param     = OpFunctionParameter %v4f32\n%label     = OpLabel\n%result    = OpVariable %fp_v4f32 Function\n             OpStore %result %param\n%loc       = OpAccessChain %fp_f32 %result %sc_final\n%val       = OpLoad %f32 %loc\n%add       = OpFAdd %f32 %val %c_f32_0_5\n             OpStore %loc %add\n%ret       = OpLoad %v4f32 %result\n             OpReturnValue %ret\n             OpFunctionEnd\n"
         ,0x1ba);
  fragments._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &fragments._M_t._M_impl.super__Rb_tree_header._M_header;
  fragments._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       fragments._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
  fragments._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  fragments._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  specConstants.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  specConstants.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  specConstants.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  paVar1 = &local_bd8.field_2;
  local_bd8._M_dataplus._M_p = (pointer)paVar1;
  fragments._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       fragments._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_bd8,"decoration","");
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&fragments,&local_bd8);
  pcVar7 = (char *)pmVar3->_M_string_length;
  strlen(decorations2);
  std::__cxx11::string::_M_replace((ulong)pmVar3,0,pcVar7,(ulong)decorations2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_bd8._M_dataplus._M_p != paVar1) {
    operator_delete(local_bd8._M_dataplus._M_p,local_bd8.field_2._M_allocated_capacity + 1);
  }
  local_bd8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_bd8,"pre_main","");
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&fragments,&local_bd8);
  pcVar7 = (char *)pmVar3->_M_string_length;
  strlen(typesAndConstants2);
  std::__cxx11::string::_M_replace((ulong)pmVar3,0,pcVar7,(ulong)typesAndConstants2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_bd8._M_dataplus._M_p != paVar1) {
    operator_delete(local_bd8._M_dataplus._M_p,local_bd8.field_2._M_allocated_capacity + 1);
  }
  local_bd8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_bd8,"testfun","");
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&fragments,&local_bd8);
  pcVar7 = (char *)pmVar3->_M_string_length;
  strlen(function2);
  std::__cxx11::string::_M_replace((ulong)pmVar3,0,pcVar7,(ulong)function2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_bd8._M_dataplus._M_p != paVar1) {
    operator_delete(local_bd8._M_dataplus._M_p,local_bd8.field_2._M_allocated_capacity + 1);
  }
  local_bd8._M_dataplus._M_p._0_4_ = 0xddd5;
  if (specConstants.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish ==
      specConstants.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
              (&specConstants,
               (iterator)
               specConstants.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish,(int *)&local_bd8);
  }
  else {
    *specConstants.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
     _M_finish = 0xddd5;
    specConstants.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = specConstants.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish + 1;
  }
  local_bd8._M_dataplus._M_p._0_4_ = 0xfffffffe;
  if (specConstants.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish ==
      specConstants.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
              (&specConstants,
               (iterator)
               specConstants.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish,(int *)&local_bd8);
  }
  else {
    *specConstants.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
     _M_finish = -2;
    specConstants.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = specConstants.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish + 1;
  }
  local_bd8._M_dataplus._M_p._0_4_ = 0xddd4;
  if (specConstants.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish ==
      specConstants.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
              (&specConstants,
               (iterator)
               specConstants.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish,(int *)&local_bd8);
  }
  else {
    *specConstants.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
     _M_finish = 0xddd4;
    specConstants.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = specConstants.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish + 1;
  }
  local_bd8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_bd8,"vector_related","");
  local_b40._M_string_length = 0;
  local_b40.field_2._M_local_buf[0] = '\0';
  local_b40._M_dataplus._M_p = (pointer)&local_b40.field_2;
  createTestsForAllStages
            (&local_bd8,&inputColors,&outputColors2,&fragments,&specConstants,local_b20,
             QP_TEST_RESULT_FAIL,&local_b40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b40._M_dataplus._M_p != &local_b40.field_2) {
    operator_delete(local_b40._M_dataplus._M_p,
                    CONCAT71(local_b40.field_2._M_allocated_capacity._1_7_,
                             local_b40.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_bd8._M_dataplus._M_p != paVar1) {
    operator_delete(local_bd8._M_dataplus._M_p,local_bd8.field_2._M_allocated_capacity + 1);
  }
  if (specConstants.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(specConstants.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)specConstants.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)specConstants.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&fragments._M_t);
  if (cases.
      super__Vector_base<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(cases.
                    super__Vector_base<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)cases.
                          super__Vector_base<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)cases.
                          super__Vector_base<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase,_std::allocator<vkt::SpirVAssembly::SpecConstantTwoIntGraphicsCase>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return local_b20;
}

Assistant:

tcu::TestCaseGroup* createSpecConstantTests (tcu::TestContext& testCtx)
{
	de::MovePtr<tcu::TestCaseGroup> group				(new tcu::TestCaseGroup(testCtx, "opspecconstantop", "Test the OpSpecConstantOp instruction"));
	vector<SpecConstantTwoIntGraphicsCase>	cases;
	RGBA							inputColors[4];
	RGBA							outputColors0[4];
	RGBA							outputColors1[4];
	RGBA							outputColors2[4];

	const char	decorations1[]			=
		"OpDecorate %sc_0  SpecId 0\n"
		"OpDecorate %sc_1  SpecId 1\n";

	const char	typesAndConstants1[]	=
		"%sc_0      = OpSpecConstant${SC_DEF0}\n"
		"%sc_1      = OpSpecConstant${SC_DEF1}\n"
		"%sc_op     = OpSpecConstantOp ${SC_RESULT_TYPE} ${SC_OP}\n";

	const char	function1[]				=
		"%test_code = OpFunction %v4f32 None %v4f32_function\n"
		"%param     = OpFunctionParameter %v4f32\n"
		"%label     = OpLabel\n"
		"%result    = OpVariable %fp_v4f32 Function\n"
		"             OpStore %result %param\n"
		"%gen       = ${GEN_RESULT}\n"
		"%index     = OpIAdd %i32 %gen %c_i32_1\n"
		"%loc       = OpAccessChain %fp_f32 %result %index\n"
		"%val       = OpLoad %f32 %loc\n"
		"%add       = OpFAdd %f32 %val %c_f32_0_5\n"
		"             OpStore %loc %add\n"
		"%ret       = OpLoad %v4f32 %result\n"
		"             OpReturnValue %ret\n"
		"             OpFunctionEnd\n";

	inputColors[0] = RGBA(127, 127, 127, 255);
	inputColors[1] = RGBA(127, 0,   0,   255);
	inputColors[2] = RGBA(0,   127, 0,   255);
	inputColors[3] = RGBA(0,   0,   127, 255);

	// Derived from inputColors[x] by adding 128 to inputColors[x][0].
	outputColors0[0] = RGBA(255, 127, 127, 255);
	outputColors0[1] = RGBA(255, 0,   0,   255);
	outputColors0[2] = RGBA(128, 127, 0,   255);
	outputColors0[3] = RGBA(128, 0,   127, 255);

	// Derived from inputColors[x] by adding 128 to inputColors[x][1].
	outputColors1[0] = RGBA(127, 255, 127, 255);
	outputColors1[1] = RGBA(127, 128, 0,   255);
	outputColors1[2] = RGBA(0,   255, 0,   255);
	outputColors1[3] = RGBA(0,   128, 127, 255);

	// Derived from inputColors[x] by adding 128 to inputColors[x][2].
	outputColors2[0] = RGBA(127, 127, 255, 255);
	outputColors2[1] = RGBA(127, 0,   128, 255);
	outputColors2[2] = RGBA(0,   127, 128, 255);
	outputColors2[3] = RGBA(0,   0,   255, 255);

	const char addZeroToSc[]		= "OpIAdd %i32 %c_i32_0 %sc_op";
	const char selectTrueUsingSc[]	= "OpSelect %i32 %sc_op %c_i32_1 %c_i32_0";
	const char selectFalseUsingSc[]	= "OpSelect %i32 %sc_op %c_i32_0 %c_i32_1";

	cases.push_back(SpecConstantTwoIntGraphicsCase("iadd",					" %i32 0",		" %i32 0",		"%i32",		"IAdd                 %sc_0 %sc_1",				19,		-20,	addZeroToSc,		outputColors0));
	cases.push_back(SpecConstantTwoIntGraphicsCase("isub",					" %i32 0",		" %i32 0",		"%i32",		"ISub                 %sc_0 %sc_1",				19,		20,		addZeroToSc,		outputColors0));
	cases.push_back(SpecConstantTwoIntGraphicsCase("imul",					" %i32 0",		" %i32 0",		"%i32",		"IMul                 %sc_0 %sc_1",				-1,		-1,		addZeroToSc,		outputColors2));
	cases.push_back(SpecConstantTwoIntGraphicsCase("sdiv",					" %i32 0",		" %i32 0",		"%i32",		"SDiv                 %sc_0 %sc_1",				-126,	126,	addZeroToSc,		outputColors0));
	cases.push_back(SpecConstantTwoIntGraphicsCase("udiv",					" %i32 0",		" %i32 0",		"%i32",		"UDiv                 %sc_0 %sc_1",				126,	126,	addZeroToSc,		outputColors2));
	cases.push_back(SpecConstantTwoIntGraphicsCase("srem",					" %i32 0",		" %i32 0",		"%i32",		"SRem                 %sc_0 %sc_1",				3,		2,		addZeroToSc,		outputColors2));
	cases.push_back(SpecConstantTwoIntGraphicsCase("smod",					" %i32 0",		" %i32 0",		"%i32",		"SMod                 %sc_0 %sc_1",				3,		2,		addZeroToSc,		outputColors2));
	cases.push_back(SpecConstantTwoIntGraphicsCase("umod",					" %i32 0",		" %i32 0",		"%i32",		"UMod                 %sc_0 %sc_1",				1001,	500,	addZeroToSc,		outputColors2));
	cases.push_back(SpecConstantTwoIntGraphicsCase("bitwiseand",			" %i32 0",		" %i32 0",		"%i32",		"BitwiseAnd           %sc_0 %sc_1",				0x33,	0x0d,	addZeroToSc,		outputColors2));
	cases.push_back(SpecConstantTwoIntGraphicsCase("bitwiseor",				" %i32 0",		" %i32 0",		"%i32",		"BitwiseOr            %sc_0 %sc_1",				0,		1,		addZeroToSc,		outputColors2));
	cases.push_back(SpecConstantTwoIntGraphicsCase("bitwisexor",			" %i32 0",		" %i32 0",		"%i32",		"BitwiseXor           %sc_0 %sc_1",				0x2e,	0x2f,	addZeroToSc,		outputColors2));
	cases.push_back(SpecConstantTwoIntGraphicsCase("shiftrightlogical",		" %i32 0",		" %i32 0",		"%i32",		"ShiftRightLogical    %sc_0 %sc_1",				2,		1,		addZeroToSc,		outputColors2));
	cases.push_back(SpecConstantTwoIntGraphicsCase("shiftrightarithmetic",	" %i32 0",		" %i32 0",		"%i32",		"ShiftRightArithmetic %sc_0 %sc_1",				-4,		2,		addZeroToSc,		outputColors0));
	cases.push_back(SpecConstantTwoIntGraphicsCase("shiftleftlogical",		" %i32 0",		" %i32 0",		"%i32",		"ShiftLeftLogical     %sc_0 %sc_1",				1,		0,		addZeroToSc,		outputColors2));
	cases.push_back(SpecConstantTwoIntGraphicsCase("slessthan",				" %i32 0",		" %i32 0",		"%bool",	"SLessThan            %sc_0 %sc_1",				-20,	-10,	selectTrueUsingSc,	outputColors2));
	cases.push_back(SpecConstantTwoIntGraphicsCase("ulessthan",				" %i32 0",		" %i32 0",		"%bool",	"ULessThan            %sc_0 %sc_1",				10,		20,		selectTrueUsingSc,	outputColors2));
	cases.push_back(SpecConstantTwoIntGraphicsCase("sgreaterthan",			" %i32 0",		" %i32 0",		"%bool",	"SGreaterThan         %sc_0 %sc_1",				-1000,	50,		selectFalseUsingSc,	outputColors2));
	cases.push_back(SpecConstantTwoIntGraphicsCase("ugreaterthan",			" %i32 0",		" %i32 0",		"%bool",	"UGreaterThan         %sc_0 %sc_1",				10,		5,		selectTrueUsingSc,	outputColors2));
	cases.push_back(SpecConstantTwoIntGraphicsCase("slessthanequal",		" %i32 0",		" %i32 0",		"%bool",	"SLessThanEqual       %sc_0 %sc_1",				-10,	-10,	selectTrueUsingSc,	outputColors2));
	cases.push_back(SpecConstantTwoIntGraphicsCase("ulessthanequal",		" %i32 0",		" %i32 0",		"%bool",	"ULessThanEqual       %sc_0 %sc_1",				50,		100,	selectTrueUsingSc,	outputColors2));
	cases.push_back(SpecConstantTwoIntGraphicsCase("sgreaterthanequal",		" %i32 0",		" %i32 0",		"%bool",	"SGreaterThanEqual    %sc_0 %sc_1",				-1000,	50,		selectFalseUsingSc,	outputColors2));
	cases.push_back(SpecConstantTwoIntGraphicsCase("ugreaterthanequal",		" %i32 0",		" %i32 0",		"%bool",	"UGreaterThanEqual    %sc_0 %sc_1",				10,		10,		selectTrueUsingSc,	outputColors2));
	cases.push_back(SpecConstantTwoIntGraphicsCase("iequal",				" %i32 0",		" %i32 0",		"%bool",	"IEqual               %sc_0 %sc_1",				42,		24,		selectFalseUsingSc,	outputColors2));
	cases.push_back(SpecConstantTwoIntGraphicsCase("logicaland",			"True %bool",	"True %bool",	"%bool",	"LogicalAnd           %sc_0 %sc_1",				0,		1,		selectFalseUsingSc,	outputColors2));
	cases.push_back(SpecConstantTwoIntGraphicsCase("logicalor",				"False %bool",	"False %bool",	"%bool",	"LogicalOr            %sc_0 %sc_1",				1,		0,		selectTrueUsingSc,	outputColors2));
	cases.push_back(SpecConstantTwoIntGraphicsCase("logicalequal",			"True %bool",	"True %bool",	"%bool",	"LogicalEqual         %sc_0 %sc_1",				0,		1,		selectFalseUsingSc,	outputColors2));
	cases.push_back(SpecConstantTwoIntGraphicsCase("logicalnotequal",		"False %bool",	"False %bool",	"%bool",	"LogicalNotEqual      %sc_0 %sc_1",				1,		0,		selectTrueUsingSc,	outputColors2));
	cases.push_back(SpecConstantTwoIntGraphicsCase("snegate",				" %i32 0",		" %i32 0",		"%i32",		"SNegate              %sc_0",					-1,		0,		addZeroToSc,		outputColors2));
	cases.push_back(SpecConstantTwoIntGraphicsCase("not",					" %i32 0",		" %i32 0",		"%i32",		"Not                  %sc_0",					-2,		0,		addZeroToSc,		outputColors2));
	cases.push_back(SpecConstantTwoIntGraphicsCase("logicalnot",			"False %bool",	"False %bool",	"%bool",	"LogicalNot           %sc_0",					1,		0,		selectFalseUsingSc,	outputColors2));
	cases.push_back(SpecConstantTwoIntGraphicsCase("select",				"False %bool",	" %i32 0",		"%i32",		"Select               %sc_0 %sc_1 %c_i32_0",	1,		1,		addZeroToSc,		outputColors2));
	// OpSConvert, OpFConvert: these two instructions involve ints/floats of different bitwidths.
	// \todo[2015-12-1 antiagainst] OpQuantizeToF16

	for (size_t caseNdx = 0; caseNdx < cases.size(); ++caseNdx)
	{
		map<string, string>	specializations;
		map<string, string>	fragments;
		vector<deInt32>		specConstants;

		specializations["SC_DEF0"]			= cases[caseNdx].scDefinition0;
		specializations["SC_DEF1"]			= cases[caseNdx].scDefinition1;
		specializations["SC_RESULT_TYPE"]	= cases[caseNdx].scResultType;
		specializations["SC_OP"]			= cases[caseNdx].scOperation;
		specializations["GEN_RESULT"]		= cases[caseNdx].resultOperation;

		fragments["decoration"]				= tcu::StringTemplate(decorations1).specialize(specializations);
		fragments["pre_main"]				= tcu::StringTemplate(typesAndConstants1).specialize(specializations);
		fragments["testfun"]				= tcu::StringTemplate(function1).specialize(specializations);

		specConstants.push_back(cases[caseNdx].scActualValue0);
		specConstants.push_back(cases[caseNdx].scActualValue1);

		createTestsForAllStages(cases[caseNdx].caseName, inputColors, cases[caseNdx].expectedColors, fragments, specConstants, group.get());
	}

	const char	decorations2[]			=
		"OpDecorate %sc_0  SpecId 0\n"
		"OpDecorate %sc_1  SpecId 1\n"
		"OpDecorate %sc_2  SpecId 2\n";

	const char	typesAndConstants2[]	=
		"%v3i32       = OpTypeVector %i32 3\n"
		"%vec3_0      = OpConstantComposite %v3i32 %c_i32_0 %c_i32_0 %c_i32_0\n"
		"%vec3_undef  = OpUndef %v3i32\n"

		"%sc_0        = OpSpecConstant %i32 0\n"
		"%sc_1        = OpSpecConstant %i32 0\n"
		"%sc_2        = OpSpecConstant %i32 0\n"
		"%sc_vec3_0   = OpSpecConstantOp %v3i32 CompositeInsert  %sc_0        %vec3_0      0\n"							// (sc_0, 0,    0)
		"%sc_vec3_1   = OpSpecConstantOp %v3i32 CompositeInsert  %sc_1        %vec3_0      1\n"							// (0,    sc_1, 0)
		"%sc_vec3_2   = OpSpecConstantOp %v3i32 CompositeInsert  %sc_2        %vec3_0      2\n"							// (0,    0,    sc_2)
		"%sc_vec3_0_s = OpSpecConstantOp %v3i32 VectorShuffle    %sc_vec3_0   %vec3_undef  0          0xFFFFFFFF 2\n"	// (sc_0, ???,  0)
		"%sc_vec3_1_s = OpSpecConstantOp %v3i32 VectorShuffle    %sc_vec3_1   %vec3_undef  0xFFFFFFFF 1          0\n"	// (???,  sc_1, 0)
		"%sc_vec3_2_s = OpSpecConstantOp %v3i32 VectorShuffle    %vec3_undef  %sc_vec3_2   5          0xFFFFFFFF 5\n"	// (sc_2, ???,  sc_2)
		"%sc_vec3_01  = OpSpecConstantOp %v3i32 VectorShuffle    %sc_vec3_0_s %sc_vec3_1_s 1 0 4\n"						// (0,    sc_0, sc_1)
		"%sc_vec3_012 = OpSpecConstantOp %v3i32 VectorShuffle    %sc_vec3_01  %sc_vec3_2_s 5 1 2\n"						// (sc_2, sc_0, sc_1)
		"%sc_ext_0    = OpSpecConstantOp %i32   CompositeExtract %sc_vec3_012              0\n"							// sc_2
		"%sc_ext_1    = OpSpecConstantOp %i32   CompositeExtract %sc_vec3_012              1\n"							// sc_0
		"%sc_ext_2    = OpSpecConstantOp %i32   CompositeExtract %sc_vec3_012              2\n"							// sc_1
		"%sc_sub      = OpSpecConstantOp %i32   ISub             %sc_ext_0    %sc_ext_1\n"								// (sc_2 - sc_0)
		"%sc_final    = OpSpecConstantOp %i32   IMul             %sc_sub      %sc_ext_2\n";								// (sc_2 - sc_0) * sc_1

	const char	function2[]				=
		"%test_code = OpFunction %v4f32 None %v4f32_function\n"
		"%param     = OpFunctionParameter %v4f32\n"
		"%label     = OpLabel\n"
		"%result    = OpVariable %fp_v4f32 Function\n"
		"             OpStore %result %param\n"
		"%loc       = OpAccessChain %fp_f32 %result %sc_final\n"
		"%val       = OpLoad %f32 %loc\n"
		"%add       = OpFAdd %f32 %val %c_f32_0_5\n"
		"             OpStore %loc %add\n"
		"%ret       = OpLoad %v4f32 %result\n"
		"             OpReturnValue %ret\n"
		"             OpFunctionEnd\n";

	map<string, string>	fragments;
	vector<deInt32>		specConstants;

	fragments["decoration"]	= decorations2;
	fragments["pre_main"]	= typesAndConstants2;
	fragments["testfun"]	= function2;

	specConstants.push_back(56789);
	specConstants.push_back(-2);
	specConstants.push_back(56788);

	createTestsForAllStages("vector_related", inputColors, outputColors2, fragments, specConstants, group.get());

	return group.release();
}